

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O2

Ivy_Obj_t ** Ivy_ObjNextFanoutPlace(Ivy_Obj_t *pObj,Ivy_Obj_t *pFanout)

{
  uint __line;
  char *__assertion;
  long lStack_10;
  
  if (((ulong)pObj & 1) == 0) {
    if (((ulong)pFanout & 1) == 0) {
      if ((Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe) == pObj) {
        lStack_10 = 0x28;
      }
      else {
        if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pObj) {
          __assertion = "Ivy_ObjFanin1(pFanout) == pObj";
          __line = 0x3f;
          goto LAB_005ecdff;
        }
        lStack_10 = 0x30;
      }
      return (Ivy_Obj_t **)((long)&pFanout->Id + lStack_10);
    }
    __assertion = "!Ivy_IsComplement(pFanout)";
    __line = 0x3c;
  }
  else {
    __assertion = "!Ivy_IsComplement(pObj)";
    __line = 0x3b;
  }
LAB_005ecdff:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                ,__line,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

static inline Ivy_Obj_t ** Ivy_ObjNextFanoutPlace( Ivy_Obj_t * pObj, Ivy_Obj_t * pFanout )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( !Ivy_IsComplement(pFanout) );
    if ( Ivy_ObjFanin0(pFanout) == pObj )
        return &pFanout->pNextFan0;
    assert( Ivy_ObjFanin1(pFanout) == pObj );
    return &pFanout->pNextFan1;
}